

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

void anon_unknown.dwarf_41b5d::InitVoice
               (Voice *voice,ALsource *source,BufferlistItem *BufferList,ALCcontext *context,
               ALCdevice *device)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  ulong uVar4;
  const_reference pvVar5;
  reference pCVar6;
  undefined4 *puVar7;
  long in_RDX;
  long in_RSI;
  EVP_PKEY_CTX *ctx;
  long in_RDI;
  long in_R8;
  ChannelData *chandata_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<ChannelData> *__range2_2;
  float w1;
  ChannelData *chandata_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<ChannelData> *__range2_1;
  ChannelData *chandata;
  iterator __end2;
  iterator __begin2;
  vector<ChannelData> *__range2;
  BandSplitter splitter;
  array<float,_4UL> scales;
  uint8_t *OrderFromChan;
  ALuint num_channels;
  BufferStorage *buffer;
  memory_order __b;
  undefined4 in_stack_ffffffffffffe7b8;
  float in_stack_ffffffffffffe7bc;
  BandSplitterR<float> *in_stack_ffffffffffffe7c0;
  undefined4 in_stack_ffffffffffffe7c8;
  undefined4 in_stack_ffffffffffffe7cc;
  SendParams *in_stack_ffffffffffffe7d0;
  size_type in_stack_ffffffffffffe7d8;
  ALCcontext *in_stack_ffffffffffffe7e0;
  Voice *in_stack_ffffffffffffe7e8;
  ALsource *in_stack_ffffffffffffe7f0;
  undefined1 *local_17f8;
  undefined1 *local_17e0;
  undefined1 *local_17b0;
  undefined1 *local_1798;
  const_pointer local_1790;
  ChannelData *local_1760;
  __normal_iterator<Voice::ChannelData_*,_std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>_>
  local_1758;
  long local_1750;
  float local_1744;
  undefined1 local_1740 [56];
  undefined1 auStack_1708 [128];
  BiquadFilterR<float> local_1688;
  BiquadFilterR<float> aBStack_166c [6];
  undefined1 auStack_15b8 [1024];
  undefined1 auStack_11b8 [16];
  undefined1 auStack_11a8 [1024];
  undefined1 auStack_da8 [404];
  undefined4 local_c14;
  reference local_c10;
  ChannelData *local_c08;
  __normal_iterator<Voice::ChannelData_*,_std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>_>
  local_c00;
  long local_bf8;
  BiquadFilterR<float> local_bf0;
  BiquadFilterR<float> BStack_bd4;
  undefined1 auStack_bb8 [128];
  BiquadFilterR<float> local_b38;
  BiquadFilterR<float> aBStack_b1c [6];
  undefined1 auStack_a68 [1024];
  undefined1 auStack_668 [16];
  undefined1 auStack_658 [1024];
  undefined1 auStack_258 [404];
  undefined4 local_c4;
  reference local_c0;
  ChannelData *local_b8;
  __normal_iterator<Voice::ChannelData_*,_std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>_>
  local_b0;
  long local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  _Type local_90;
  const_pointer local_80;
  undefined1 local_78 [28];
  uint local_5c;
  long local_58;
  long local_50;
  long local_40;
  long local_38;
  long local_30;
  int local_20;
  undefined4 local_1c;
  undefined4 *local_18;
  undefined4 local_c;
  undefined1 *local_8;
  
  local_50 = in_R8;
  local_40 = in_RDX;
  local_38 = in_RSI;
  local_30 = in_RDI;
  std::atomic<BufferlistItem_*>::store
            ((atomic<BufferlistItem_*> *)in_stack_ffffffffffffe7d0,
             (__pointer_type)CONCAT44(in_stack_ffffffffffffe7cc,in_stack_ffffffffffffe7c8),
             (memory_order)((ulong)in_stack_ffffffffffffe7c0 >> 0x20));
  local_58 = *(long *)(local_40 + 0x10);
  local_5c = BufferStorage::channelsFromFmt((BufferStorage *)0x16e440);
  *(undefined4 *)(local_30 + 0x19c) = *(undefined4 *)(local_58 + 0x28);
  *(undefined1 *)(local_30 + 0x198) = *(undefined1 *)(local_58 + 0x2c);
  uVar2 = BufferStorage::bytesFromFmt((BufferStorage *)0x16e486);
  *(uint *)(local_30 + 0x1a0) = uVar2;
  *(undefined1 *)(local_30 + 0x1a4) = *(undefined1 *)(local_58 + 0x34);
  *(undefined1 *)(local_30 + 0x1a5) = *(undefined1 *)(local_58 + 0x35);
  *(undefined4 *)(local_30 + 0x1a8) = *(undefined4 *)(local_58 + 0x38);
  if (*(long *)(local_58 + 0x18) == 0) {
    if (*(int *)(local_38 + 0x174) == 0x1028) {
      *(uint *)(local_30 + 0x1d0) = *(uint *)(local_30 + 0x1d0) | 1;
    }
  }
  else {
    *(uint *)(local_30 + 0x1d0) = *(uint *)(local_30 + 0x1d0) | 2;
  }
  *(undefined4 *)(local_30 + 0x1d4) = 0;
  *(undefined4 *)(local_30 + 0x1ac) = 0;
  sVar3 = std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::capacity
                    ((vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *)
                     (local_30 + 0x280));
  if ((2 < sVar3) &&
     (uVar4 = (ulong)local_5c,
     sVar3 = std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::capacity
                       ((vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *)
                        (local_30 + 0x280)), uVar4 < sVar3)) {
    memset(local_78,0,0x18);
    std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::vector
              ((vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *)0x16e5c8);
    std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::swap
              ((vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *)
               in_stack_ffffffffffffe7d0,
               (vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *)
               CONCAT44(in_stack_ffffffffffffe7cc,in_stack_ffffffffffffe7c8));
    std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::~vector
              ((vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *)
               in_stack_ffffffffffffe7d0);
  }
  maxu(2,local_5c);
  std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::reserve
            ((vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *)
             in_stack_ffffffffffffe7f0,(size_type)in_stack_ffffffffffffe7e8);
  std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::resize
            ((vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *)
             in_stack_ffffffffffffe7e0,in_stack_ffffffffffffe7d8);
  if ((*(int *)(local_30 + 0x1a8) == 0) ||
     (*(uint *)(local_50 + 0x1c) <= *(uint *)(local_30 + 0x1a8))) {
    local_bf8 = local_30 + 0x280;
    local_c00._M_current =
         (ChannelData *)
         std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::begin
                   ((vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *)
                    CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8));
    local_c08 = (ChannelData *)
                std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::end
                          ((vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *)
                           CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<Voice::ChannelData_*,_std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>_>
                               *)in_stack_ffffffffffffe7c0,
                              (__normal_iterator<Voice::ChannelData_*,_std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>_>
                               *)CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8)),
          bVar1) {
      local_c10 = __gnu_cxx::
                  __normal_iterator<Voice::ChannelData_*,_std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>_>
                  ::operator*(&local_c00);
      local_c14 = 0;
      std::array<float,_48UL>::fill
                ((array<float,_48UL> *)in_stack_ffffffffffffe7d0,
                 (value_type_conflict *)
                 CONCAT44(in_stack_ffffffffffffe7cc,in_stack_ffffffffffffe7c8));
      memset(&local_1688,0,0xa70);
      BiquadFilterR<float>::BiquadFilterR(&local_1688);
      BiquadFilterR<float>::BiquadFilterR(aBStack_166c);
      local_17e0 = auStack_15b8;
      do {
        local_17e0 = local_17e0 + 8;
      } while (local_17e0 != auStack_11b8);
      local_17f8 = auStack_11a8;
      do {
        local_17f8 = local_17f8 + 8;
      } while (local_17f8 != auStack_da8);
      memcpy(&local_c10->mDryParams,&local_1688,0xa70);
      in_stack_ffffffffffffe7f0 =
           (ALsource *)std::array<SendParams,_6UL>::begin((array<SendParams,_6UL> *)0x16eb53);
      in_stack_ffffffffffffe7e0 = (ALCcontext *)local_1740;
      memset(in_stack_ffffffffffffe7e0,0,0x1c);
      BiquadFilterR<float>::BiquadFilterR((BiquadFilterR<float> *)in_stack_ffffffffffffe7e0);
      in_stack_ffffffffffffe7e8 = (Voice *)(local_1740 + 0x1c);
      memset(in_stack_ffffffffffffe7e8,0,0x1c);
      BiquadFilterR<float>::BiquadFilterR((BiquadFilterR<float> *)in_stack_ffffffffffffe7e8);
      memset(auStack_1708,0,0x80);
      std::fill_n<SendParams*,unsigned_int,SendParams>
                ((SendParams *)in_stack_ffffffffffffe7e0,(uint)(in_stack_ffffffffffffe7d8 >> 0x20),
                 in_stack_ffffffffffffe7d0);
      __gnu_cxx::
      __normal_iterator<Voice::ChannelData_*,_std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>_>
      ::operator++(&local_c00);
    }
  }
  else {
    if (*(char *)(local_30 + 0x198) == '\a') {
      local_1790 = std::array<unsigned_char,_7UL>::data((array<unsigned_char,_7UL> *)0x16e69a);
    }
    else {
      local_1790 = std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)0x16e6b0);
    }
    local_80 = local_1790;
    local_90 = (_Type)BFormatDec::GetHFOrderScales
                                ((ALuint)((ulong)in_stack_ffffffffffffe7d0 >> 0x20),
                                 (ALuint)in_stack_ffffffffffffe7d0);
    BandSplitterR<float>::BandSplitterR(in_stack_ffffffffffffe7c0,in_stack_ffffffffffffe7bc);
    local_a8 = local_30 + 0x280;
    local_b0._M_current =
         (ChannelData *)
         std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::begin
                   ((vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *)
                    CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8));
    local_b8 = (ChannelData *)
               std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::end
                         ((vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *)
                          CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<Voice::ChannelData_*,_std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>_>
                               *)in_stack_ffffffffffffe7c0,
                              (__normal_iterator<Voice::ChannelData_*,_std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>_>
                               *)CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8)),
          bVar1) {
      local_c0 = __gnu_cxx::
                 __normal_iterator<Voice::ChannelData_*,_std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>_>
                 ::operator*(&local_b0);
      local_c4 = 0;
      std::array<float,_48UL>::fill
                ((array<float,_48UL> *)in_stack_ffffffffffffe7d0,
                 (value_type_conflict *)
                 CONCAT44(in_stack_ffffffffffffe7cc,in_stack_ffffffffffffe7c8));
      local_80 = local_80 + 1;
      pvVar5 = std::array<float,_4UL>::operator[]
                         ((array<float,_4UL> *)in_stack_ffffffffffffe7c0,
                          CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8));
      local_c0->mAmbiScale = *pvVar5;
      (local_c0->mAmbiSplitter).mCoeff = (float)(undefined4)local_a0;
      (local_c0->mAmbiSplitter).mLpZ1 = (float)local_a0._4_4_;
      (local_c0->mAmbiSplitter).mLpZ2 = (float)(undefined4)local_98;
      (local_c0->mAmbiSplitter).mApZ1 = (float)local_98._4_4_;
      memset(&local_b38,0,0xa70);
      BiquadFilterR<float>::BiquadFilterR(&local_b38);
      BiquadFilterR<float>::BiquadFilterR(aBStack_b1c);
      local_1798 = auStack_a68;
      do {
        local_1798 = local_1798 + 8;
      } while (local_1798 != auStack_668);
      local_17b0 = auStack_658;
      do {
        local_17b0 = local_17b0 + 8;
      } while (local_17b0 != auStack_258);
      memcpy(&local_c0->mDryParams,&local_b38,0xa70);
      std::array<SendParams,_6UL>::begin((array<SendParams,_6UL> *)0x16e919);
      memset(&local_bf0,0,0x1c);
      BiquadFilterR<float>::BiquadFilterR(&local_bf0);
      memset(&BStack_bd4,0,0x1c);
      BiquadFilterR<float>::BiquadFilterR(&BStack_bd4);
      memset(auStack_bb8,0,0x80);
      std::fill_n<SendParams*,unsigned_int,SendParams>
                ((SendParams *)in_stack_ffffffffffffe7e0,(uint)(in_stack_ffffffffffffe7d8 >> 0x20),
                 in_stack_ffffffffffffe7d0);
      __gnu_cxx::
      __normal_iterator<Voice::ChannelData_*,_std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>_>
      ::operator++(&local_b0);
    }
    *(uint *)(local_30 + 0x1d0) = *(uint *)(local_30 + 0x1d0) | 4;
  }
  if (0.0 < *(float *)(local_50 + 0x16c)) {
    local_1744 = 343.3 / (*(float *)(local_50 + 0x16c) * (float)*(uint *)(local_50 + 0xc));
    local_1750 = local_30 + 0x280;
    local_1758._M_current =
         (ChannelData *)
         std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::begin
                   ((vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *)
                    CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8));
    local_1760 = (ChannelData *)
                 std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>::end
                           ((vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_> *)
                            CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8));
    while( true ) {
      ctx = (EVP_PKEY_CTX *)&local_1760;
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Voice::ChannelData_*,_std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>_>
                          *)in_stack_ffffffffffffe7c0,
                         (__normal_iterator<Voice::ChannelData_*,_std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe7bc,in_stack_ffffffffffffe7b8));
      if (!bVar1) break;
      pCVar6 = __gnu_cxx::
               __normal_iterator<Voice::ChannelData_*,_std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>_>
               ::operator*(&local_1758);
      NfcFilter::init(&(pCVar6->mDryParams).NFCtrlFilter,ctx);
      __gnu_cxx::
      __normal_iterator<Voice::ChannelData_*,_std::vector<Voice::ChannelData,_al::allocator<Voice::ChannelData,_16UL>_>_>
      ::operator++(&local_1758);
    }
  }
  local_8 = (undefined1 *)(local_38 + 0x188);
  local_c = 4;
  LOCK();
  *local_8 = 1;
  UNLOCK();
  UpdateSourceProps(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7e8,in_stack_ffffffffffffe7e0);
  puVar7 = (undefined4 *)(local_30 + 0x170);
  local_1c = *(undefined4 *)(local_38 + 400);
  local_20 = 3;
  local_18 = puVar7;
  std::operator&(memory_order_release,__memory_order_mask);
  if (local_20 == 3) {
    *puVar7 = local_1c;
  }
  else if (local_20 == 5) {
    LOCK();
    *puVar7 = local_1c;
    UNLOCK();
  }
  else {
    *puVar7 = local_1c;
  }
  return;
}

Assistant:

void InitVoice(Voice *voice, ALsource *source, BufferlistItem *BufferList, ALCcontext *context,
    ALCdevice *device)
{
    voice->mLoopBuffer.store(source->Looping ? source->queue : nullptr, std::memory_order_relaxed);

    BufferStorage *buffer{BufferList->mBuffer};
    ALuint num_channels{buffer->channelsFromFmt()};
    voice->mFrequency = buffer->mSampleRate;
    voice->mFmtChannels = buffer->mChannels;
    voice->mSampleSize  = buffer->bytesFromFmt();
    voice->mAmbiLayout = buffer->mAmbiLayout;
    voice->mAmbiScaling = buffer->mAmbiScaling;
    voice->mAmbiOrder = buffer->mAmbiOrder;

    if(buffer->mCallback) voice->mFlags |= VoiceIsCallback;
    else if(source->SourceType == AL_STATIC) voice->mFlags |= VoiceIsStatic;
    voice->mNumCallbackSamples = 0;

    /* Clear the stepping value explicitly so the mixer knows not to mix this
     * until the update gets applied.
     */
    voice->mStep = 0;

    if(voice->mChans.capacity() > 2 && num_channels < voice->mChans.capacity())
        al::vector<Voice::ChannelData>{}.swap(voice->mChans);
    voice->mChans.reserve(maxu(2, num_channels));
    voice->mChans.resize(num_channels);

    /* Don't need to set the VOICE_IS_AMBISONIC flag if the device is not
     * higher order than the voice. No HF scaling is necessary to mix it.
     */
    if(voice->mAmbiOrder && device->mAmbiOrder > voice->mAmbiOrder)
    {
        const uint8_t *OrderFromChan{(voice->mFmtChannels == FmtBFormat2D) ?
            AmbiIndex::OrderFrom2DChannel.data() :
            AmbiIndex::OrderFromChannel.data()};
        const auto scales = BFormatDec::GetHFOrderScales(voice->mAmbiOrder, device->mAmbiOrder);

        const BandSplitter splitter{400.0f / static_cast<float>(device->Frequency)};

        for(auto &chandata : voice->mChans)
        {
            chandata.mPrevSamples.fill(0.0f);
            chandata.mAmbiScale = scales[*(OrderFromChan++)];
            chandata.mAmbiSplitter = splitter;
            chandata.mDryParams = DirectParams{};
            std::fill_n(chandata.mWetParams.begin(), device->NumAuxSends, SendParams{});
        }

        voice->mFlags |= VoiceIsAmbisonic;
    }
    else
    {
        /* Clear previous samples. */
        for(auto &chandata : voice->mChans)
        {
            chandata.mPrevSamples.fill(0.0f);
            chandata.mDryParams = DirectParams{};
            std::fill_n(chandata.mWetParams.begin(), device->NumAuxSends, SendParams{});
        }
    }

    if(device->AvgSpeakerDist > 0.0f)
    {
        const float w1{SpeedOfSoundMetersPerSec /
            (device->AvgSpeakerDist * static_cast<float>(device->Frequency))};
        for(auto &chandata : voice->mChans)
            chandata.mDryParams.NFCtrlFilter.init(w1);
    }

    source->PropsClean.test_and_set(std::memory_order_acq_rel);
    UpdateSourceProps(source, voice, context);

    voice->mSourceID.store(source->id, std::memory_order_release);
}